

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O2

void xc_mgga_vxc_fxc_kxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,double *vrho,double *vsigma,double *vlapl,double *vtau,
                        double *v2rho2,double *v2rhosigma,double *v2rholapl,double *v2rhotau,
                        double *v2sigma2,double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,
                        double *v2lapltau,double *v2tau2,double *v3rho3,double *v3rho2sigma,
                        double *v3rho2lapl,double *v3rho2tau,double *v3rhosigma2,
                        double *v3rhosigmalapl,double *v3rhosigmatau,double *v3rholapl2,
                        double *v3rholapltau,double *v3rhotau2,double *v3sigma3,double *v3sigma2lapl
                        ,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,
                        double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
                        double *v3tau3)

{
  xc_mgga_out_params out;
  
  memset(&out,0,0x230);
  out.vrho = vrho;
  out.vsigma = vsigma;
  out.vlapl = vlapl;
  out.vtau = vtau;
  out.v2rho2 = v2rho2;
  out.v2rhosigma = v2rhosigma;
  out.v2rholapl = v2rholapl;
  out.v2rhotau = v2rhotau;
  out.v2sigma2 = v2sigma2;
  out.v2sigmalapl = v2sigmalapl;
  out.v2sigmatau = v2sigmatau;
  out.v2lapl2 = v2lapl2;
  out.v2lapltau = v2lapltau;
  out.v2tau2 = v2tau2;
  out.v3rho3 = v3rho3;
  out.v3rho2sigma = v3rho2sigma;
  out.v3rho2lapl = v3rho2lapl;
  out.v3rho2tau = v3rho2tau;
  out.v3rhosigma2 = v3rhosigma2;
  out.v3rhosigmalapl = v3rhosigmalapl;
  out.v3rhosigmatau = v3rhosigmatau;
  out.v3rholapl2 = v3rholapl2;
  out.v3rholapltau = v3rholapltau;
  out.v3rhotau2 = v3rhotau2;
  out.v3sigma3 = v3sigma3;
  out.v3sigma2lapl = v3sigma2lapl;
  out.v3sigma2tau = v3sigma2tau;
  out.v3sigmalapl2 = v3sigmalapl2;
  out.v3sigmalapltau = v3sigmalapltau;
  out.v3sigmatau2 = v3sigmatau2;
  out.v3lapl3 = v3lapl3;
  out.v3lapl2tau = v3lapl2tau;
  out.v3lapltau2 = v3lapltau2;
  out.v3tau3 = v3tau3;
  xc_mgga_new(p,3,np,rho,sigma,lapl,tau,&out);
  return;
}

Assistant:

void xc_mgga_vxc_fxc_kxc(const xc_func_type *p, size_t np,
                         const double *rho, const double *sigma, const double *lapl, const double *tau,
                         double *vrho, double *vsigma, double *vlapl, double *vtau,
                         double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                         double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                         double *v2lapltau, double *v2tau2,
                         double *v3rho3, double *v3rho2sigma, double *v3rho2lapl, double *v3rho2tau,
                         double *v3rhosigma2, double *v3rhosigmalapl, double *v3rhosigmatau,
                         double *v3rholapl2, double *v3rholapltau, double *v3rhotau2, double *v3sigma3,
                         double *v3sigma2lapl, double *v3sigma2tau, double *v3sigmalapl2, double *v3sigmalapltau,
                         double *v3sigmatau2, double *v3lapl3, double *v3lapl2tau, double *v3lapltau2,
                         double *v3tau3)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_1;
  SET_ORDER_2;
  SET_ORDER_3;

  xc_mgga_new(p, 3, np, rho, sigma, lapl, tau, &out);
}